

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O3

void Wlc_NtkAbsMarkNodes_rec
               (Wlc_Ntk_t *p,Wlc_Obj_t *pObj,Vec_Bit_t *vLeaves,Vec_Int_t *vPisOld,
               Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  ushort uVar1;
  int iVar2;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar3;
  uint Entry;
  ulong uVar4;
  long lVar5;
  
  uVar1 = *(ushort *)pObj;
  if ((char)uVar1 < '\0') {
    return;
  }
  *(ushort *)pObj = uVar1 | 0x80;
  uVar4 = ((long)pObj - (long)p->pObjs >> 3) * -0x5555555555555555;
  Entry = (uint)uVar4;
  if ((-1 < (int)Entry) && ((int)Entry < vLeaves->nSize)) {
    if ((*(uint *)((long)vLeaves->pArray + (ulong)((uint)(uVar4 >> 3) & 0xffffffc)) >>
         (Entry & 0x1f) & 1) == 0) {
      if ((uVar1 & 0x3d) != 1) {
        uVar4 = (ulong)pObj->nFanins;
        if ((int)pObj->nFanins < 1) {
          return;
        }
        lVar5 = 0;
        while( true ) {
          if ((2 < (uint)uVar4) || (paVar3 = &pObj->field_10, (*(uint *)pObj & 0x3f | 0x10) == 0x16)
             ) {
            paVar3 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
          }
          iVar2 = paVar3->Fanins[lVar5];
          if (((long)iVar2 < 1) || (p->nObjsAlloc <= iVar2)) break;
          Wlc_NtkAbsMarkNodes_rec(p,p->pObjs + iVar2,vLeaves,vPisOld,vPisNew,vFlops);
          lVar5 = lVar5 + 1;
          uVar4 = (ulong)(int)pObj->nFanins;
          if ((long)uVar4 <= lVar5) {
            return;
          }
        }
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      vPisNew = vFlops;
      if ((uVar1 & 3) == 1) {
        vPisNew = vPisOld;
      }
    }
    else if ((uVar1 & 0x3f) == 1) {
      __assert_fail("!Wlc_ObjIsPi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcAbs2.c"
                    ,0x6d,
                    "void Wlc_NtkAbsMarkNodes_rec(Wlc_Ntk_t *, Wlc_Obj_t *, Vec_Bit_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Vec_IntPush(vPisNew,Entry);
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

static void Wlc_NtkAbsMarkNodes_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, Vec_Bit_t * vLeaves, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    int i, iFanin;
    if ( pObj->Mark )
        return;
    pObj->Mark = 1;
    if ( Vec_BitEntry(vLeaves, Wlc_ObjId(p, pObj)) )
    {
        assert( !Wlc_ObjIsPi(pObj) );
        Vec_IntPush( vPisNew, Wlc_ObjId(p, pObj) );
        return;
    }
    if ( Wlc_ObjIsCi(pObj) )
    {
        if ( Wlc_ObjIsPi(pObj) )
            Vec_IntPush( vPisOld, Wlc_ObjId(p, pObj) );
        else
            Vec_IntPush( vFlops, Wlc_ObjId(p, pObj) );
        return;
    }
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkAbsMarkNodes_rec( p, Wlc_NtkObj(p, iFanin), vLeaves, vPisOld, vPisNew, vFlops );
}